

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Columns(int columns_count,char *id,bool border)

{
  float _y;
  float fVar1;
  ImDrawList *this;
  bool bVar2;
  ImGuiID IVar3;
  value_type *pvVar4;
  float fVar5;
  float fVar6;
  float local_d4;
  float local_cc;
  char *local_c8;
  int local_b4;
  ImGuiCol local_a4;
  float t;
  float default_t;
  ImGuiID column_id_1;
  int column_index;
  float content_region_width;
  ImVec2 local_80;
  float local_78;
  ImU32 local_74;
  float xi;
  ImU32 col;
  bool held;
  bool hovered;
  ImVec2 local_64;
  undefined1 local_5c [8];
  ImRect column_rect;
  ImGuiID column_id;
  float x;
  int i;
  float y2;
  float y1;
  ImGuiWindow *local_30;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *pcStack_18;
  bool border_local;
  char *id_local;
  int columns_count_local;
  
  window = (ImGuiWindow *)GImGui;
  g._7_1_ = border;
  pcStack_18 = id;
  id_local._4_4_ = columns_count;
  local_30 = GetCurrentWindow();
  if (id_local._4_4_ < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x2495,"void ImGui::Columns(int, const char *, bool)");
  }
  if ((local_30->DC).ColumnsCount != 1) {
    if ((local_30->DC).ColumnsCurrent != 0) {
      ImVec2::ImVec2((ImVec2 *)&y2,0.0,0.0);
      ItemSize((ImVec2 *)&y2,0.0);
    }
    PopItemWidth();
    PopClipRect();
    ImDrawList::ChannelsMerge(local_30->DrawList);
    fVar5 = ImMax((local_30->DC).ColumnsCellMaxY,(local_30->DC).CursorPos.y);
    (local_30->DC).ColumnsCellMaxY = fVar5;
    (local_30->DC).CursorPos.y = (local_30->DC).ColumnsCellMaxY;
  }
  if (((((local_30->DC).ColumnsCount != id_local._4_4_) && ((local_30->DC).ColumnsCount != 1)) &&
      (((local_30->DC).ColumnsShowBorders & 1U) != 0)) && ((local_30->SkipItems & 1U) == 0)) {
    fVar5 = (local_30->DC).ColumnsStartPosY;
    _y = (local_30->DC).CursorPos.y;
    for (column_id = 1; (int)column_id < (local_30->DC).ColumnsCount; column_id = column_id + 1) {
      fVar1 = (local_30->Pos).x;
      fVar6 = GetColumnOffset(column_id);
      column_rect.Max.y = fVar1 + fVar6;
      column_rect.Max.x = (float)((local_30->DC).ColumnsSetId + column_id);
      ImVec2::ImVec2(&local_64,column_rect.Max.y - 4.0,fVar5);
      ImVec2::ImVec2((ImVec2 *)&col,column_rect.Max.y + 4.0,_y);
      ImRect::ImRect((ImRect *)local_5c,&local_64,(ImVec2 *)&col);
      bVar2 = IsClippedEx((ImRect *)local_5c,(ImGuiID *)&column_rect.Max,false);
      if (!bVar2) {
        ButtonBehavior((ImRect *)local_5c,(ImGuiID)column_rect.Max.x,(bool *)((long)&xi + 3),
                       (bool *)((long)&xi + 2),0);
        if (((xi._3_1_ & 1) != 0) || ((xi._2_1_ & 1) != 0)) {
          window[9].ScrollbarX = true;
          window[9].ScrollbarY = false;
          *(undefined2 *)&window[9].field_0x7a = 0;
        }
        if ((xi._2_1_ & 1) == 0) {
          local_a4 = 0x1c;
          if ((xi._3_1_ & 1) != 0) {
            local_a4 = 0x1d;
          }
        }
        else {
          local_a4 = 0x1e;
        }
        local_74 = GetColorU32(local_a4,1.0);
        local_78 = (float)(int)column_rect.Max.y;
        this = local_30->DrawList;
        ImVec2::ImVec2(&local_80,local_78,fVar5 + 1.0);
        ImVec2::ImVec2((ImVec2 *)&column_index,local_78,_y);
        ImDrawList::AddLine(this,&local_80,(ImVec2 *)&column_index,local_74,1.0);
        if ((xi._2_1_ & 1) != 0) {
          if (((ulong)window[8].DC.AllowKeyboardFocusStack.Data & 0x10000000000) != 0) {
            window[8].DC.ButtonRepeatStack.Size =
                 (int)((float)window[8].DC.ButtonRepeatStack.Size - 4.0);
          }
          column_rect.Max.y = GetDraggedColumnOffset(column_id);
          SetColumnOffset(column_id,column_rect.Max.y);
        }
      }
    }
  }
  if (pcStack_18 == (char *)0x0) {
    local_b4 = id_local._4_4_;
  }
  else {
    local_b4 = 0;
  }
  PushID(local_b4 + 0x11223347);
  if (pcStack_18 == (char *)0x0) {
    local_c8 = "columns";
  }
  else {
    local_c8 = pcStack_18;
  }
  IVar3 = ImGuiWindow::GetID(local_30,local_c8,(char *)0x0);
  (local_30->DC).ColumnsSetId = IVar3;
  PopID();
  (local_30->DC).ColumnsCurrent = 0;
  (local_30->DC).ColumnsCount = id_local._4_4_;
  (local_30->DC).ColumnsShowBorders = (bool)(g._7_1_ & 1);
  fVar5 = (local_30->SizeContentsExplicit).x;
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    local_cc = (local_30->SizeContentsExplicit).x;
  }
  else {
    local_cc = (local_30->Size).x;
  }
  (local_30->DC).ColumnsMinX = (local_30->DC).IndentX;
  if ((local_30->Flags & 8U) == 0) {
    local_d4 = window[7].DC.CursorPosPrevLine.x;
  }
  else {
    local_d4 = 0.0;
  }
  (local_30->DC).ColumnsMaxX = (local_cc - (local_30->Scroll).x) - local_d4;
  (local_30->DC).ColumnsStartPosY = (local_30->DC).CursorPos.y;
  fVar5 = (local_30->DC).CursorPos.y;
  (local_30->DC).ColumnsCellMaxY = fVar5;
  (local_30->DC).ColumnsCellMinY = fVar5;
  (local_30->DC).ColumnsOffsetX = 0.0;
  (local_30->DC).CursorPos.x =
       (float)(int)((local_30->Pos).x + (local_30->DC).IndentX + (local_30->DC).ColumnsOffsetX);
  if ((local_30->DC).ColumnsCount == 1) {
    ImVector<ImGuiColumnData>::resize(&(local_30->DC).ColumnsData,0);
  }
  else {
    ImVector<ImGuiColumnData>::resize(&(local_30->DC).ColumnsData,id_local._4_4_ + 1);
    for (default_t = 0.0; (int)default_t < id_local._4_4_ + 1;
        default_t = (float)((int)default_t + 1)) {
      IVar3 = (local_30->DC).ColumnsSetId + (int)default_t;
      KeepAliveID(IVar3);
      fVar5 = ImGuiStorage::GetFloat
                        ((local_30->DC).StateStorage,IVar3,
                         (float)(int)default_t / (float)(local_30->DC).ColumnsCount);
      pvVar4 = ImVector<ImGuiColumnData>::operator[](&(local_30->DC).ColumnsData,(int)default_t);
      pvVar4->OffsetNorm = fVar5;
    }
    ImDrawList::ChannelsSplit(local_30->DrawList,(local_30->DC).ColumnsCount);
    PushColumnClipRect(-1);
    fVar5 = GetColumnWidth(-1);
    PushItemWidth(fVar5 * 0.65);
  }
  return;
}

Assistant:

void ImGui::Columns(int columns_count, const char* id, bool border)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(columns_count >= 1);

    if (window->DC.ColumnsCount != 1)
    {
        if (window->DC.ColumnsCurrent != 0)
            ItemSize(ImVec2(0,0));   // Advance to column 0
        PopItemWidth();
        PopClipRect();
        window->DrawList->ChannelsMerge();

        window->DC.ColumnsCellMaxY = ImMax(window->DC.ColumnsCellMaxY, window->DC.CursorPos.y);
        window->DC.CursorPos.y = window->DC.ColumnsCellMaxY;
    }

    // Draw columns borders and handle resize at the time of "closing" a columns set
    if (window->DC.ColumnsCount != columns_count && window->DC.ColumnsCount != 1 && window->DC.ColumnsShowBorders && !window->SkipItems)
    {
        const float y1 = window->DC.ColumnsStartPosY;
        const float y2 = window->DC.CursorPos.y;
        for (int i = 1; i < window->DC.ColumnsCount; i++)
        {
            float x = window->Pos.x + GetColumnOffset(i);
            const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(i);
            const ImRect column_rect(ImVec2(x-4,y1),ImVec2(x+4,y2));
            if (IsClippedEx(column_rect, &column_id, false))
                continue;

            bool hovered, held;
            ButtonBehavior(column_rect, column_id, &hovered, &held);
            if (hovered || held)
                g.MouseCursor = ImGuiMouseCursor_ResizeEW;

            // Draw before resize so our items positioning are in sync with the line being drawn
            const ImU32 col = GetColorU32(held ? ImGuiCol_ColumnActive : hovered ? ImGuiCol_ColumnHovered : ImGuiCol_Column);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, y1+1.0f), ImVec2(xi, y2), col);

            if (held)
            {
                if (g.ActiveIdIsJustActivated)
                    g.ActiveIdClickOffset.x -= 4;   // Store from center of column line (we used a 8 wide rect for columns clicking)
                x = GetDraggedColumnOffset(i);
                SetColumnOffset(i, x);
            }
        }
    }

    // Differentiate column ID with an arbitrary prefix for cases where users name their columns set the same as another widget.
    // In addition, when an identifier isn't explicitly provided we include the number of columns in the hash to make it uniquer.
    PushID(0x11223347 + (id ? 0 : columns_count));
    window->DC.ColumnsSetId = window->GetID(id ? id : "columns");
    PopID();

    // Set state for first column
    window->DC.ColumnsCurrent = 0;
    window->DC.ColumnsCount = columns_count;
    window->DC.ColumnsShowBorders = border;

    const float content_region_width = (window->SizeContentsExplicit.x != 0.0f) ? window->SizeContentsExplicit.x : window->Size.x;
    window->DC.ColumnsMinX = window->DC.IndentX; // Lock our horizontal range
    window->DC.ColumnsMaxX = content_region_width - window->Scroll.x - ((window->Flags & ImGuiWindowFlags_NoScrollbar) ? 0 : g.Style.ScrollbarSize);// - window->WindowPadding().x;
    window->DC.ColumnsStartPosY = window->DC.CursorPos.y;
    window->DC.ColumnsCellMinY = window->DC.ColumnsCellMaxY = window->DC.CursorPos.y;
    window->DC.ColumnsOffsetX = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX);

    if (window->DC.ColumnsCount != 1)
    {
        // Cache column offsets
        window->DC.ColumnsData.resize(columns_count + 1);
        for (int column_index = 0; column_index < columns_count + 1; column_index++)
        {
            const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(column_index);
            KeepAliveID(column_id);
            const float default_t = column_index / (float)window->DC.ColumnsCount;
            const float t = window->DC.StateStorage->GetFloat(column_id, default_t);      // Cheaply store our floating point value inside the integer (could store a union into the map?)
            window->DC.ColumnsData[column_index].OffsetNorm = t;
        }
        window->DrawList->ChannelsSplit(window->DC.ColumnsCount);
        PushColumnClipRect();
        PushItemWidth(GetColumnWidth() * 0.65f);
    }
    else
    {
        window->DC.ColumnsData.resize(0);
    }
}